

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O1

pair<unsigned_int,_unsigned_int> __thiscall
FMB::FiniteModelMultiSorted::getDomainConstant(FiniteModelMultiSorted *this,Term *t)

{
  long lVar1;
  Entry *pEVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  long *local_88;
  long local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Term *local_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_68 = t;
  pEVar2 = ::Lib::
           DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&this->_domainConstantsRev,&local_68);
  if (pEVar2 != (Entry *)0x0) {
    return pEVar2->_val;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x50);
  Kernel::Term::toString_abi_cxx11_(&local_60,local_68,true);
  std::operator+(&local_40,"Evaluated to ",&local_60);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_88 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_88 == plVar5) {
    local_78 = *plVar5;
    uStack_70 = (undefined4)plVar4[3];
    uStack_6c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar5;
  }
  lVar1 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  *puVar3 = &PTR_cry_00b69f40;
  puVar3[1] = puVar3 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 1),local_88,lVar1 + (long)local_88);
  *puVar3 = &PTR_cry_00b6a028;
  *(undefined4 *)(puVar3 + 5) = 0;
  puVar3[6] = puVar3 + 8;
  puVar3[7] = 0;
  *(undefined1 *)(puVar3 + 8) = 0;
  __cxa_throw(puVar3,&::Lib::UserErrorException::typeinfo,
              ::Lib::UserErrorException::~UserErrorException);
}

Assistant:

std::pair<unsigned,unsigned> getDomainConstant(Term* t)
  {
    std::pair<unsigned,unsigned> pair;
    if(_domainConstantsRev.find(t,pair)) return pair;
    USER_ERROR("Evaluated to "+t->toString()+" when expected a domain constant, probably a partial model");
  }